

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

JSON * __thiscall chaiscript::json::JSON::operator[](JSON *this,size_t index)

{
  variant_alternative_t<2UL,_variant<std::nullptr_t,_QuickFlatMap<basic_string<char,_char_traits<char>,_allocator<char>_>,_JSON,_equal_to<void>_>,_vector<JSON,_allocator<JSON>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_double,_long,_bool>_>
  *this_00;
  pointer pJVar1;
  
  this_00 = Internal::get_set_type<(chaiscript::json::JSON::Class)2>(&this->internal);
  pJVar1 = (this_00->
           super__Vector_base<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this_00->
                     super__Vector_base<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pJVar1) / 0x28) <= index) {
    std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>::resize
              (this_00,index + 1);
    pJVar1 = (this_00->
             super__Vector_base<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>).
             _M_impl.super__Vector_impl_data._M_start;
  }
  return pJVar1 + index;
}

Assistant:

JSON &operator[](const size_t index) {
      auto &vec = internal.Vector();
      if (index >= vec.size()) {
        vec.resize(index + 1);
      }

      return vec.operator[](index);
    }